

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_result_zeroblob64(sqlite3_context *pCtx,u64 n)

{
  ulong in_RSI;
  undefined8 *in_RDI;
  Mem *pOut;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if ((ulong)(long)((Mem *)*in_RDI)->db->aLimit[0] < in_RSI) {
    sqlite3_result_error_toobig((sqlite3_context *)0x13f522);
    local_4 = 0x12;
  }
  else {
    sqlite3VdbeMemSetZeroBlob((Mem *)*in_RDI,in_stack_ffffffffffffffdc);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_result_zeroblob64(sqlite3_context *pCtx, u64 n){
  Mem *pOut;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return SQLITE_MISUSE_BKPT;
#endif
  pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  if( n>(u64)pOut->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(pCtx);
    return SQLITE_TOOBIG;
  }
#ifndef SQLITE_OMIT_INCRBLOB
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
  return SQLITE_OK;
#else
  return sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
#endif
}